

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

double get_rate_correction_factor(AV1_COMP *cpi,int width,int height)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  double dVar4;
  double rate_correction_factors_rflvl;
  RATE_FACTOR_LEVEL rf_lvl;
  double rate_correction_factors_internormal;
  double rate_correction_factors_gfarfstd;
  double rate_correction_factors_kfstd;
  double rcf;
  RefreshFrameInfo *refresh_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMP *local_78;
  AV1_COMP *local_68;
  AV1_COMP *local_60;
  AV1_COMP *local_30;
  
  lVar1 = *in_RDI;
  if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
    local_60 = *(AV1_COMP **)(lVar1 + 0xad20);
  }
  else {
    local_60 = (AV1_COMP *)in_RDI[0xc112];
  }
  if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
    local_68 = *(AV1_COMP **)(lVar1 + 0xad18);
  }
  else {
    local_68 = (AV1_COMP *)in_RDI[0xc111];
  }
  if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
    local_30 = *(AV1_COMP **)(lVar1 + 0xad08);
  }
  else {
    local_30 = (AV1_COMP *)in_RDI[0xc10f];
  }
  if ((char)in_RDI[0x77f0] == '\0') {
    local_30 = local_60;
  }
  else {
    iVar3 = is_stat_consumption_stage(local_30);
    if (iVar3 == 0) {
      if (((((*(byte *)((long)in_RDI + 0x42d7a) & 1) != 0) ||
           ((*(byte *)(in_RDI + 0x85af) & 1) != 0)) && ((int)in_RDI[0xc0f5] == 0)) &&
         ((*(int *)(*in_RDI + 0xc750) == 0 &&
          ((*(int *)((long)in_RDI + 0x423dc) != 1 || (0x14 < *(uint *)((long)in_RDI + 0x423bc)))))))
      {
        local_30 = local_68;
      }
    }
    else {
      bVar2 = get_rate_factor_level((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258));
      if (*(int *)(*in_RDI + 0x317c + (ulong)*(byte *)(in_RDI + 0xe258) * 4) < 1) {
        local_78 = *(AV1_COMP **)(lVar1 + 0xad08 + (ulong)bVar2 * 8);
      }
      else {
        local_78 = (AV1_COMP *)in_RDI[(ulong)bVar2 + 0xc10f];
      }
      local_30 = local_78;
    }
  }
  dVar4 = resize_rate_factor((FrameDimensionCfg *)(in_RDI + 0x8467),in_ESI,in_EDX);
  dVar4 = fclamp(dVar4 * (double)local_30,0.005,50.0);
  return dVar4;
}

Assistant:

static double get_rate_correction_factor(const AV1_COMP *cpi, int width,
                                         int height) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  double rcf;
  double rate_correction_factors_kfstd;
  double rate_correction_factors_gfarfstd;
  double rate_correction_factors_internormal;

  rate_correction_factors_kfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[KF_STD]
          : p_rc->rate_correction_factors[KF_STD];
  rate_correction_factors_gfarfstd =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[GF_ARF_STD]
          : p_rc->rate_correction_factors[GF_ARF_STD];
  rate_correction_factors_internormal =
      (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
          ? rc->frame_level_rate_correction_factors[INTER_NORMAL]
          : p_rc->rate_correction_factors[INTER_NORMAL];

  if (cpi->common.current_frame.frame_type == KEY_FRAME) {
    rcf = rate_correction_factors_kfstd;
  } else if (is_stat_consumption_stage(cpi)) {
    const RATE_FACTOR_LEVEL rf_lvl =
        get_rate_factor_level(&cpi->ppi->gf_group, cpi->gf_frame_index);
    double rate_correction_factors_rflvl =
        (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0)
            ? rc->frame_level_rate_correction_factors[rf_lvl]
            : p_rc->rate_correction_factors[rf_lvl];
    rcf = rate_correction_factors_rflvl;
  } else {
    if ((refresh_frame->alt_ref_frame || refresh_frame->golden_frame) &&
        !rc->is_src_frame_alt_ref && !cpi->ppi->use_svc &&
        (cpi->oxcf.rc_cfg.mode != AOM_CBR ||
         cpi->oxcf.rc_cfg.gf_cbr_boost_pct > 20))
      rcf = rate_correction_factors_gfarfstd;
    else
      rcf = rate_correction_factors_internormal;
  }
  rcf *= resize_rate_factor(&cpi->oxcf.frm_dim_cfg, width, height);
  return fclamp(rcf, MIN_BPB_FACTOR, MAX_BPB_FACTOR);
}